

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocTestApprovals.h
# Opt level: O0

void __thiscall
ApprovalTests::anon_unknown_1::DocTestApprovalListener::test_case_start
          (DocTestApprovalListener *this,TestCaseData *testInfo)

{
  long in_RDI;
  anon_class_1_0_00000001 *__f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff90;
  function<void_()> *this_00;
  string *in_stack_ffffffffffffff98;
  TestName *in_stack_ffffffffffffffa0;
  TestPassedNotification *in_stack_ffffffffffffffb0;
  DocTestApprovalListener *in_stack_ffffffffffffffb8;
  function<void_()> local_30;
  
  __f = (anon_class_1_0_00000001 *)(in_RDI + 8);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const*const&>(in_stack_ffffffffffffff90,(char **)__f);
  this_00 = &local_30;
  (anonymous_namespace)::DocTestApprovalListener::doctestToString_abi_cxx11_
            (in_stack_ffffffffffffffb8,(String *)in_stack_ffffffffffffffb0);
  TestName::setFileName(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  ::std::__cxx11::string::~string((string *)&local_30);
  FrameworkIntegrations::setCurrentTest((TestName *)0x12852a);
  ::std::function<void()>::
  function<ApprovalTests::(anonymous_namespace)::DocTestApprovalListener::test_case_start(doctest::TestCaseData_const&)::_lambda()_1_,void>
            (this_00,__f);
  FrameworkIntegrations::setTestPassedNotification(in_stack_ffffffffffffffb0);
  ::std::function<void_()>::~function((function<void_()> *)0x128552);
  return;
}

Assistant:

void test_case_start(const doctest::TestCaseData& testInfo) override
            {
                currentTest.sections.emplace_back(testInfo.m_name);
                currentTest.setFileName(doctestToString(testInfo.m_file));
                ApprovalTests::FrameworkIntegrations::setCurrentTest(&currentTest);
                ApprovalTests::FrameworkIntegrations::setTestPassedNotification(
                    []() { REQUIRE(true); });
            }